

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,int number,Extension *other_extension)

{
  FieldType type;
  FieldDescriptor *pFVar1;
  ArenaImpl *pAVar2;
  Rep *pRVar3;
  byte bVar4;
  int iVar5;
  Extension *pEVar6;
  LogMessage *pLVar7;
  RepeatedField<int> *this_00;
  RepeatedField<unsigned_long> *this_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar8;
  RepeatedField<long> *this_02;
  RepeatedField<unsigned_int> *this_03;
  RepeatedField<bool> *this_04;
  RepeatedField<double> *this_05;
  RepeatedField<float> *this_06;
  string *psVar9;
  MessageLite *pMVar10;
  Type *pTVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int64 iVar13;
  undefined4 extraout_var_03;
  _func_int **pp_Var14;
  int iVar15;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar16;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  LogMessage local_78;
  ExtensionSet *local_40;
  LogFinisher local_31;
  long *plVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_02;
  
  if (other_extension->is_repeated == true) {
    pFVar1 = other_extension->descriptor;
    local_40 = this;
    pVar16 = Insert(this,number);
    pEVar6 = pVar16.first;
    pEVar6->descriptor = pFVar1;
    if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (pEVar6->type != other_extension->type) {
        LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                   ,0x3ab);
        pLVar7 = LogMessage::operator<<
                           (&local_78,"CHECK failed: (extension->type) == (other_extension.type): ")
        ;
        LogFinisher::operator=(&local_31,pLVar7);
        LogMessage::~LogMessage(&local_78);
      }
      if (pEVar6->is_packed != other_extension->is_packed) {
        LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                   ,0x3ac);
        pLVar7 = LogMessage::operator<<
                           (&local_78,
                            "CHECK failed: (extension->is_packed) == (other_extension.is_packed): ")
        ;
        LogFinisher::operator=(&local_31,pLVar7);
        LogMessage::~LogMessage(&local_78);
      }
      if (pEVar6->is_repeated == false) {
        LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                   ,0x3ad);
        pLVar7 = LogMessage::operator<<(&local_78,"CHECK failed: extension->is_repeated: ");
        LogFinisher::operator=(&local_31,pLVar7);
        LogMessage::~LogMessage(&local_78);
      }
    }
    else {
      pEVar6->type = other_extension->type;
      pEVar6->is_packed = other_extension->is_packed;
      pEVar6->is_repeated = true;
    }
    bVar4 = other_extension->type;
    if ((byte)(bVar4 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar7 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_31,pLVar7);
      LogMessage::~LogMessage(&local_78);
    }
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar4 * 4)) {
    case 1:
    case 8:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_00 = (pEVar6->field_0).repeated_int32_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_00 = (RepeatedField<int> *)operator_new(0x10);
          this_00->current_size_ = 0;
          this_00->total_size_ = 0;
          this_00->arena_or_elements_ = (void *)0x0;
        }
        else {
          if (pAVar2[1].initial_block_ != (Block *)0x0) {
            Arena::OnArenaAllocation
                      ((Arena *)pAVar2,(type_info *)&RepeatedField<int>::typeinfo,0x10);
          }
          this_00 = (RepeatedField<int> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<int>>);
          this_00->current_size_ = 0;
          this_00->total_size_ = 0;
          this_00->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00;
      }
      RepeatedField<int>::MergeFrom(this_00,(other_extension->field_0).repeated_int32_value);
      return;
    case 2:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_02 = (pEVar6->field_0).repeated_int64_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_02 = (RepeatedField<long> *)operator_new(0x10);
          this_02->current_size_ = 0;
          this_02->total_size_ = 0;
          this_02->arena_or_elements_ = (void *)0x0;
        }
        else {
          if (pAVar2[1].initial_block_ != (Block *)0x0) {
            Arena::OnArenaAllocation
                      ((Arena *)pAVar2,(type_info *)&RepeatedField<long>::typeinfo,0x10);
          }
          this_02 = (RepeatedField<long> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<long>>);
          this_02->current_size_ = 0;
          this_02->total_size_ = 0;
          this_02->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_02;
      }
      RepeatedField<long>::MergeFrom(this_02,(other_extension->field_0).repeated_int64_value);
      return;
    case 3:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_03 = (pEVar6->field_0).repeated_uint32_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_03 = (RepeatedField<unsigned_int> *)operator_new(0x10);
          this_03->current_size_ = 0;
          this_03->total_size_ = 0;
          this_03->arena_or_elements_ = (void *)0x0;
        }
        else {
          if (pAVar2[1].initial_block_ != (Block *)0x0) {
            Arena::OnArenaAllocation
                      ((Arena *)pAVar2,(type_info *)&RepeatedField<unsigned_int>::typeinfo,0x10);
          }
          this_03 = (RepeatedField<unsigned_int> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>)
          ;
          this_03->current_size_ = 0;
          this_03->total_size_ = 0;
          this_03->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_03;
      }
      RepeatedField<unsigned_int>::MergeFrom
                (this_03,(other_extension->field_0).repeated_uint32_value);
      return;
    case 4:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_01 = (pEVar6->field_0).repeated_uint64_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_01 = (RepeatedField<unsigned_long> *)operator_new(0x10);
          this_01->current_size_ = 0;
          this_01->total_size_ = 0;
          this_01->arena_or_elements_ = (void *)0x0;
        }
        else {
          if (pAVar2[1].initial_block_ != (Block *)0x0) {
            Arena::OnArenaAllocation
                      ((Arena *)pAVar2,(type_info *)&RepeatedField<unsigned_long>::typeinfo,0x10);
          }
          this_01 = (RepeatedField<unsigned_long> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>
                              );
          this_01->current_size_ = 0;
          this_01->total_size_ = 0;
          this_01->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_01;
      }
      RepeatedField<unsigned_long>::MergeFrom
                (this_01,(other_extension->field_0).repeated_uint64_value);
      return;
    case 5:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_05 = (pEVar6->field_0).repeated_double_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_05 = (RepeatedField<double> *)operator_new(0x10);
          this_05->current_size_ = 0;
          this_05->total_size_ = 0;
          this_05->arena_or_elements_ = (void *)0x0;
        }
        else {
          if (pAVar2[1].initial_block_ != (Block *)0x0) {
            Arena::OnArenaAllocation
                      ((Arena *)pAVar2,(type_info *)&RepeatedField<double>::typeinfo,0x10);
          }
          this_05 = (RepeatedField<double> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<double>>);
          this_05->current_size_ = 0;
          this_05->total_size_ = 0;
          this_05->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_05;
      }
      RepeatedField<double>::MergeFrom(this_05,(other_extension->field_0).repeated_double_value);
      return;
    case 6:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_06 = (pEVar6->field_0).repeated_float_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_06 = (RepeatedField<float> *)operator_new(0x10);
          this_06->current_size_ = 0;
          this_06->total_size_ = 0;
          this_06->arena_or_elements_ = (void *)0x0;
        }
        else {
          if (pAVar2[1].initial_block_ != (Block *)0x0) {
            Arena::OnArenaAllocation
                      ((Arena *)pAVar2,(type_info *)&RepeatedField<float>::typeinfo,0x10);
          }
          this_06 = (RepeatedField<float> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<float>>);
          this_06->current_size_ = 0;
          this_06->total_size_ = 0;
          this_06->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_06;
      }
      RepeatedField<float>::MergeFrom(this_06,(other_extension->field_0).repeated_float_value);
      return;
    case 7:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_04 = (pEVar6->field_0).repeated_bool_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_04 = (RepeatedField<bool> *)operator_new(0x10);
          this_04->current_size_ = 0;
          this_04->total_size_ = 0;
          this_04->arena_or_elements_ = (void *)0x0;
        }
        else {
          if (pAVar2[1].initial_block_ != (Block *)0x0) {
            Arena::OnArenaAllocation
                      ((Arena *)pAVar2,(type_info *)&RepeatedField<bool>::typeinfo,0x10);
          }
          this_04 = (RepeatedField<bool> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<bool>>);
          this_04->current_size_ = 0;
          this_04->total_size_ = 0;
          this_04->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_04;
      }
      RepeatedField<bool>::MergeFrom(this_04,(other_extension->field_0).repeated_bool_value);
      return;
    case 9:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        psVar9 = (pEVar6->field_0).string_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          psVar9 = (string *)operator_new(0x18);
          (psVar9->_M_dataplus)._M_p = (pointer)0x0;
          psVar9->_M_string_length = 0;
          (psVar9->field_2)._M_allocated_capacity = 0;
        }
        else {
          if (pAVar2[1].initial_block_ != (Block *)0x0) {
            Arena::OnArenaAllocation
                      ((Arena *)pAVar2,
                       (type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18);
          }
          psVar9 = (string *)
                   ArenaImpl::AllocateAlignedAndAddCleanup
                             (pAVar2,0x18,
                              arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                             );
          (psVar9->_M_dataplus)._M_p = (pointer)pAVar2;
          psVar9->_M_string_length = 0;
          (psVar9->field_2)._M_allocated_capacity = 0;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)psVar9;
      }
      RepeatedPtrFieldBase::
      MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)psVar9,
                 (RepeatedPtrFieldBase *)(other_extension->field_0).string_value);
      return;
    case 10:
      goto switchD_0014215e_caseD_a;
    default:
      return;
    }
  }
  if ((other_extension->field_0xa & 1) != 0) {
    return;
  }
  bVar4 = other_extension->type;
  if ((byte)(bVar4 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
               ,0x3c);
    pLVar7 = LogMessage::operator<<
                       (&local_78,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_31,pLVar7);
    LogMessage::~LogMessage(&local_78);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar4 * 4)) {
  case 1:
    SetInt32(this,number,other_extension->type,(other_extension->field_0).int32_value,
             other_extension->descriptor);
    break;
  case 2:
    SetInt64(this,number,other_extension->type,(other_extension->field_0).int64_value,
             other_extension->descriptor);
    break;
  case 3:
    SetUInt32(this,number,other_extension->type,(other_extension->field_0).uint32_value,
              other_extension->descriptor);
    break;
  case 4:
    SetUInt64(this,number,other_extension->type,(other_extension->field_0).uint64_value,
              other_extension->descriptor);
    break;
  case 5:
    SetDouble(this,number,other_extension->type,(other_extension->field_0).double_value,
              other_extension->descriptor);
    break;
  case 6:
    SetFloat(this,number,other_extension->type,(other_extension->field_0).float_value,
             other_extension->descriptor);
    break;
  case 7:
    SetBool(this,number,other_extension->type,(other_extension->field_0).bool_value,
            other_extension->descriptor);
    break;
  case 8:
    SetEnum(this,number,other_extension->type,(other_extension->field_0).enum_value,
            other_extension->descriptor);
    break;
  case 9:
    type = other_extension->type;
    pp_Var14 = ((other_extension->field_0).lazymessage_value)->_vptr_LazyMessageExtension;
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,pp_Var14,
               (long)(other_extension->field_0).lazymessage_value[1]._vptr_LazyMessageExtension +
               (long)pp_Var14);
    psVar9 = MutableString_abi_cxx11_(this,number,type,other_extension->descriptor);
    std::__cxx11::string::operator=((string *)psVar9,(string *)local_98);
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
    break;
  case 10:
    pFVar1 = other_extension->descriptor;
    pVar16 = Insert(this,number);
    pEVar6 = pVar16.first;
    pEVar6->descriptor = pFVar1;
    if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (pEVar6->type != other_extension->type) {
        LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                   ,0x40a);
        pLVar7 = LogMessage::operator<<
                           (&local_78,"CHECK failed: (extension->type) == (other_extension.type): ")
        ;
        LogFinisher::operator=(&local_31,pLVar7);
        LogMessage::~LogMessage(&local_78);
      }
      if (pEVar6->is_packed != other_extension->is_packed) {
        LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                   ,0x40b);
        pLVar7 = LogMessage::operator<<
                           (&local_78,
                            "CHECK failed: (extension->is_packed) == (other_extension.is_packed): ")
        ;
        LogFinisher::operator=(&local_31,pLVar7);
        LogMessage::~LogMessage(&local_78);
      }
      if (pEVar6->is_repeated == true) {
        LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                   ,0x40c);
        pLVar7 = LogMessage::operator<<(&local_78,"CHECK failed: !extension->is_repeated: ");
        LogFinisher::operator=(&local_31,pLVar7);
        LogMessage::~LogMessage(&local_78);
      }
      pMVar10 = (pEVar6->field_0).message_value;
      if ((other_extension->field_0xa & 0x10) == 0) {
        if ((pEVar6->field_0xa & 0x10) != 0) {
          iVar15 = (*pMVar10->_vptr_MessageLite[4])(pMVar10);
          pMVar10 = (MessageLite *)CONCAT44(extraout_var_03,iVar15);
          goto LAB_001428bb;
        }
        (*pMVar10->_vptr_MessageLite[8])();
      }
      else {
        if ((pEVar6->field_0xa & 0x10) == 0) {
          iVar15 = (*((other_extension->field_0).message_value)->_vptr_MessageLite[3])
                             ((other_extension->field_0).message_value,pMVar10);
          iVar13 = CONCAT44(extraout_var_02,iVar15);
          pp_Var14 = pMVar10->_vptr_MessageLite;
          goto LAB_001428c4;
        }
        (*pMVar10->_vptr_MessageLite[0xd])(pMVar10);
      }
    }
    else {
      pEVar6->type = other_extension->type;
      pEVar6->is_packed = other_extension->is_packed;
      pEVar6->is_repeated = false;
      bVar4 = pEVar6->field_0xa & 0xf;
      if ((other_extension->field_0xa & 0x10) == 0) {
        pEVar6->field_0xa = bVar4;
        iVar15 = (*((other_extension->field_0).message_value)->_vptr_MessageLite[4])
                           ((other_extension->field_0).message_value,this->arena_);
        pMVar10 = (MessageLite *)CONCAT44(extraout_var,iVar15);
        (pEVar6->field_0).message_value = pMVar10;
LAB_001428bb:
        iVar13 = (other_extension->field_0).int64_value;
        pp_Var14 = pMVar10->_vptr_MessageLite;
LAB_001428c4:
        (*pp_Var14[8])(pMVar10,iVar13);
      }
      else {
        pEVar6->field_0xa = bVar4 | 0x10;
        iVar15 = (*((other_extension->field_0).message_value)->_vptr_MessageLite[2])
                           ((other_extension->field_0).message_value,this->arena_);
        pMVar10 = (MessageLite *)CONCAT44(extraout_var_01,iVar15);
        (pEVar6->field_0).message_value = pMVar10;
        (*pMVar10->_vptr_MessageLite[0xd])(pMVar10,(other_extension->field_0).int64_value);
      }
    }
    pEVar6->field_0xa = pEVar6->field_0xa & 0xf0;
  }
  return;
switchD_0014215e_caseD_a:
  if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pAVar2 = (ArenaImpl *)local_40->arena_;
    if (pAVar2 == (ArenaImpl *)0x0) {
      pRVar8 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x18);
      (pRVar8->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (pRVar8->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar8->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar8->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    else {
      if (pAVar2[1].initial_block_ != (Block *)0x0) {
        Arena::OnArenaAllocation
                  ((Arena *)pAVar2,
                   (type_info *)&RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,0x18);
      }
      pRVar8 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)ArenaImpl::AllocateAlignedAndAddCleanup
                            (pAVar2,0x18,
                             arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                            );
      (pRVar8->super_RepeatedPtrFieldBase).arena_ = (Arena *)pAVar2;
      (pRVar8->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar8->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar8->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    (pEVar6->field_0).repeated_string_value = pRVar8;
  }
  psVar9 = (other_extension->field_0).string_value;
  if ((int)psVar9->_M_string_length < 1) {
    return;
  }
  iVar15 = 0;
  do {
    pTVar11 = RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                        ((RepeatedPtrFieldBase *)psVar9,iVar15);
    pRVar8 = (pEVar6->field_0).repeated_string_value;
    pRVar3 = (pRVar8->super_RepeatedPtrFieldBase).rep_;
    if (pRVar3 == (Rep *)0x0) {
LAB_0014276b:
      iVar5 = (*pTVar11->_vptr_MessageLite[4])(pTVar11,local_40->arena_);
      plVar12 = (long *)CONCAT44(extraout_var_00,iVar5);
      RepeatedPtrFieldBase::
      AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                ((RepeatedPtrFieldBase *)(pEVar6->field_0).int64_value,plVar12);
    }
    else {
      iVar5 = (pRVar8->super_RepeatedPtrFieldBase).current_size_;
      if (pRVar3->allocated_size <= iVar5) goto LAB_0014276b;
      (pRVar8->super_RepeatedPtrFieldBase).current_size_ = iVar5 + 1;
      plVar12 = (long *)pRVar3->elements[iVar5];
      if (plVar12 == (long *)0x0) goto LAB_0014276b;
    }
    (**(code **)(*plVar12 + 0x40))(plVar12,pTVar11);
    iVar15 = iVar15 + 1;
    if ((int)psVar9->_M_string_length <= iVar15) {
      return;
    }
  } while( true );
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(
    int number, const Extension& other_extension) {
  if (other_extension.is_repeated) {
    Extension* extension;
    bool is_new =
        MaybeNewExtension(number, other_extension.descriptor, &extension);
    if (is_new) {
      // Extension did not already exist in set.
      extension->type = other_extension.type;
      extension->is_packed = other_extension.is_packed;
      extension->is_repeated = true;
    } else {
      GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
      GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
      GOOGLE_DCHECK(extension->is_repeated);
    }

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE) \
  case WireFormatLite::CPPTYPE_##UPPERCASE:              \
    if (is_new) {                                        \
      extension->repeated_##LOWERCASE##_value =          \
          Arena::CreateMessage<REPEATED_TYPE>(arena_);   \
    }                                                    \
    extension->repeated_##LOWERCASE##_value->MergeFrom(  \
        *other_extension.repeated_##LOWERCASE##_value);  \
    break;

      HANDLE_TYPE(INT32, int32, RepeatedField<int32>);
      HANDLE_TYPE(INT64, int64, RepeatedField<int64>);
      HANDLE_TYPE(UINT32, uint32, RepeatedField<uint32>);
      HANDLE_TYPE(UINT64, uint64, RepeatedField<uint64>);
      HANDLE_TYPE(FLOAT, float, RepeatedField<float>);
      HANDLE_TYPE(DOUBLE, double, RepeatedField<double>);
      HANDLE_TYPE(BOOL, bool, RepeatedField<bool>);
      HANDLE_TYPE(ENUM, enum, RepeatedField<int>);
      HANDLE_TYPE(STRING, string, RepeatedPtrField<std::string>);
#undef HANDLE_TYPE

      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_new) {
          extension->repeated_message_value =
              Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
        }
        // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
        // it would attempt to allocate new objects.
        RepeatedPtrField<MessageLite>* other_repeated_message =
            other_extension.repeated_message_value;
        for (int i = 0; i < other_repeated_message->size(); i++) {
          const MessageLite& other_message = other_repeated_message->Get(i);
          MessageLite* target =
              reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                  extension->repeated_message_value)
                  ->AddFromCleared<GenericTypeHandler<MessageLite>>();
          if (target == NULL) {
            target = other_message.New(arena_);
            extension->repeated_message_value->AddAllocated(target);
          }
          target->CheckTypeAndMergeFrom(other_message);
        }
        break;
    }
  } else {
    if (!other_extension.is_cleared) {
      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)  \
  case WireFormatLite::CPPTYPE_##UPPERCASE:           \
    Set##CAMELCASE(number, other_extension.type,      \
                   other_extension.LOWERCASE##_value, \
                   other_extension.descriptor);       \
    break;

        HANDLE_TYPE(INT32, int32, Int32);
        HANDLE_TYPE(INT64, int64, Int64);
        HANDLE_TYPE(UINT32, uint32, UInt32);
        HANDLE_TYPE(UINT64, uint64, UInt64);
        HANDLE_TYPE(FLOAT, float, Float);
        HANDLE_TYPE(DOUBLE, double, Double);
        HANDLE_TYPE(BOOL, bool, Bool);
        HANDLE_TYPE(ENUM, enum, Enum);
#undef HANDLE_TYPE
        case WireFormatLite::CPPTYPE_STRING:
          SetString(number, other_extension.type, *other_extension.string_value,
                    other_extension.descriptor);
          break;
        case WireFormatLite::CPPTYPE_MESSAGE: {
          Extension* extension;
          bool is_new =
              MaybeNewExtension(number, other_extension.descriptor, &extension);
          if (is_new) {
            extension->type = other_extension.type;
            extension->is_packed = other_extension.is_packed;
            extension->is_repeated = false;
            if (other_extension.is_lazy) {
              extension->is_lazy = true;
              extension->lazymessage_value =
                  other_extension.lazymessage_value->New(arena_);
              extension->lazymessage_value->MergeFrom(
                  *other_extension.lazymessage_value);
            } else {
              extension->is_lazy = false;
              extension->message_value =
                  other_extension.message_value->New(arena_);
              extension->message_value->CheckTypeAndMergeFrom(
                  *other_extension.message_value);
            }
          } else {
            GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
            GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
            GOOGLE_DCHECK(!extension->is_repeated);
            if (other_extension.is_lazy) {
              if (extension->is_lazy) {
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    other_extension.lazymessage_value->GetMessage(
                        *extension->message_value));
              }
            } else {
              if (extension->is_lazy) {
                extension->lazymessage_value
                    ->MutableMessage(*other_extension.message_value)
                    ->CheckTypeAndMergeFrom(*other_extension.message_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            }
          }
          extension->is_cleared = false;
          break;
        }
      }
    }
  }
}